

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis_simplification.cpp
# Opt level: O1

SENode * __thiscall
spvtools::opt::SENodeSimplifyImpl::EliminateZeroCoefficientRecurrents
          (SENodeSimplifyImpl *this,SENode *node)

{
  pointer ppSVar1;
  long *plVar2;
  ScalarEvolutionAnalysis *pSVar3;
  iterator iVar4;
  SENodeSimplifyImpl *pSVar5;
  int iVar6;
  undefined4 extraout_var;
  long lVar7;
  undefined4 extraout_var_00;
  reference ppSVar8;
  SENode *pSVar9;
  SENode **ppSVar10;
  pointer ppSVar11;
  SENode *__range2;
  SENode *child;
  SENode *local_78;
  uint local_6c;
  SENode **local_68;
  iterator iStack_60;
  SENode **local_58;
  SENodeSimplifyImpl *local_48;
  _Head_base<0UL,_spvtools::opt::SENode_*,_false> local_40;
  SENode *local_38;
  
  iVar6 = (**node->_vptr_SENode)(node);
  if (iVar6 == 2) {
    local_68 = (SENode **)0x0;
    iStack_60._M_current = (SENode **)0x0;
    local_58 = (SENode **)0x0;
    ppSVar11 = (node->children_).
               super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppSVar1 = (node->children_).
              super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    if (ppSVar11 != ppSVar1) {
      local_6c = 0;
      local_48 = this;
      do {
        local_78 = *ppSVar11;
        iVar6 = (**local_78->_vptr_SENode)();
        if (iVar6 == 1) {
          iVar6 = (*local_78->_vptr_SENode[6])();
          plVar2 = *(long **)(CONCAT44(extraout_var,iVar6) + 0x30);
          iVar6 = (**(code **)*plVar2)(plVar2);
          if (iVar6 != 0) goto LAB_005d421a;
          lVar7 = (**(code **)(*plVar2 + 0x20))(plVar2);
          if (*(long *)(lVar7 + 0x30) != 0) goto LAB_005d421a;
          iVar6 = (*local_78->_vptr_SENode[6])();
          local_38 = *(SENode **)(CONCAT44(extraout_var_00,iVar6) + 0x38);
          ppSVar8 = std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>::
                    emplace_back<spvtools::opt::SENode*>
                              ((vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>
                                *)&local_68,&local_38);
          local_6c = (uint)CONCAT71((int7)((ulong)ppSVar8 >> 8),1);
        }
        else {
LAB_005d421a:
          if (iStack_60._M_current == local_58) {
            std::vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>>::
            _M_realloc_insert<spvtools::opt::SENode*const&>
                      ((vector<spvtools::opt::SENode*,std::allocator<spvtools::opt::SENode*>> *)
                       &local_68,iStack_60,&local_78);
          }
          else {
            *iStack_60._M_current = local_78;
            iStack_60._M_current = iStack_60._M_current + 1;
          }
        }
        ppSVar11 = ppSVar11 + 1;
      } while (ppSVar11 != ppSVar1);
      if ((local_6c & 1) != 0) {
        pSVar9 = (SENode *)operator_new(0x30);
        pSVar5 = local_48;
        iVar4._M_current = iStack_60._M_current;
        pSVar3 = local_48->node_->parent_analysis_;
        pSVar9->_vptr_SENode = (_func_int **)&PTR___cxa_pure_virtual_00b1eed0;
        (pSVar9->children_).
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        (pSVar9->children_).
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        (pSVar9->children_).
        super__Vector_base<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pSVar9->parent_analysis_ = pSVar3;
        SENode::NumberOfNodes = SENode::NumberOfNodes + 1;
        pSVar9->unique_id_ = SENode::NumberOfNodes;
        pSVar9->_vptr_SENode = (_func_int **)&PTR_GetType_00b1f250;
        for (ppSVar10 = local_68; ppSVar10 != iVar4._M_current; ppSVar10 = ppSVar10 + 1) {
          (*pSVar9->_vptr_SENode[3])(pSVar9,*ppSVar10);
        }
        local_40._M_head_impl = pSVar9;
        node = ScalarEvolutionAnalysis::GetCachedOrAdd
                         (pSVar5->analysis_,
                          (unique_ptr<spvtools::opt::SENode,_std::default_delete<spvtools::opt::SENode>_>
                           *)&local_40);
        if (local_40._M_head_impl != (SENode *)0x0) {
          (*(local_40._M_head_impl)->_vptr_SENode[2])();
        }
        local_40._M_head_impl = (SENode *)0x0;
      }
    }
    if (local_68 != (SENode **)0x0) {
      operator_delete(local_68,(long)local_58 - (long)local_68);
    }
  }
  return node;
}

Assistant:

SENode* SENodeSimplifyImpl::EliminateZeroCoefficientRecurrents(SENode* node) {
  if (node->GetType() != SENode::Add) return node;

  bool has_change = false;

  std::vector<SENode*> new_children{};
  for (SENode* child : *node) {
    if (child->GetType() == SENode::RecurrentAddExpr) {
      SENode* coefficient = child->AsSERecurrentNode()->GetCoefficient();
      // If coefficient is zero then we can eliminate the recurrent expression
      // entirely and just return the offset as the recurrent expression is
      // representing the equation coefficient*iterations + offset.
      if (coefficient->GetType() == SENode::Constant &&
          coefficient->AsSEConstantNode()->FoldToSingleValue() == 0) {
        new_children.push_back(child->AsSERecurrentNode()->GetOffset());
        has_change = true;
      } else {
        new_children.push_back(child);
      }
    } else {
      new_children.push_back(child);
    }
  }

  if (!has_change) return node;

  std::unique_ptr<SENode> new_add{new SEAddNode(node_->GetParentAnalysis())};

  for (SENode* child : new_children) {
    new_add->AddChild(child);
  }

  return analysis_.GetCachedOrAdd(std::move(new_add));
}